

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

void __thiscall NaPNDelay::print_status(NaPNDelay *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  NaPetriNet *this_00;
  char *pcVar4;
  char *pcVar5;
  NaVector *pNVar6;
  NaReal *pNVar7;
  NaPetriNode *in_RDI;
  int j;
  int i;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  NaPetriCnInput *in_stack_ffffffffffffffc8;
  uint local_10;
  uint local_c;
  
  this_00 = NaPetriNode::net(in_RDI);
  pcVar4 = NaPetriNet::name(this_00);
  pcVar5 = NaPetriNode::name(in_RDI);
  NaPrintLog("NaPNDelay (%p, %s.%s):",in_RDI,pcVar4,pcVar5);
  NaPrintLog("  nMaxLag=%u,  nMinLag=%u\n",(ulong)*(uint *)&in_RDI[5].pcaPorts.pHead,
             (ulong)*(uint *)((long)&in_RDI[5].pcaPorts.pHead + 4));
  NaPrintLog("  nActiveSleep=%u\n",(ulong)*(uint *)&in_RDI[5].pcaPorts.pTail);
  pcVar4 = "false";
  if (((ulong)in_RDI[5].pcaPorts.pTail & 0x100000000) != 0) {
    pcVar4 = "true";
  }
  NaPrintLog("  bAwaken=%s\n",pcVar4);
  if (((ulong)in_RDI[5].pcaPorts.pTail & 0x10000000000) == 0) {
    NaPrintLog("  bSleepValue=false\n");
  }
  else if (((ulong)in_RDI[5].pcaPorts.pTail & 0x1000000000000) == 0) {
    NaPrintLog(*(char **)&in_RDI[5].bHalt,"  bSleepValue=true,  fSleepValue=%g\n");
  }
  else {
    NaPrintLog("  bSleepValue=true,  fSleepValue=(First)\n");
  }
  NaPrintLog("  delays map:");
  for (local_c = 0; (int)local_c < *(int *)&in_RDI[6].pcaPorts._vptr_NaDynAr; local_c = local_c + 1)
  {
    NaPrintLog(" %u",(ulong)*(uint *)((long)&(in_RDI[6].pNet)->_vptr_NaPetriNet +
                                     (long)(int)local_c * 4));
  }
  NaPrintLog("\n");
  bVar1 = NaPetriNode::tunable(in_RDI);
  if (!bVar1) {
    NaPrintLog("  delayed values in buffer:\n");
    local_10 = 0;
    while( true ) {
      uVar2 = NaVector::dim((NaVector *)&in_RDI[5].nActivations);
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
      uVar3 = (*pNVar6->_vptr_NaVector[6])();
      if (uVar2 / uVar3 <= local_10) break;
      local_c = 0;
      while (((int)local_c < *(int *)&in_RDI[6].pcaPorts._vptr_NaDynAr &&
             (*(uint *)((long)&(in_RDI[6].pNet)->_vptr_NaPetriNet + (long)(int)local_c * 4) !=
              local_10))) {
        local_c = local_c + 1;
      }
      if ((int)local_c < *(int *)&in_RDI[6].pcaPorts._vptr_NaDynAr) {
        NaPrintLog("  [%d] ->",
                   (ulong)*(uint *)((long)&(in_RDI[6].pNet)->_vptr_NaPetriNet +
                                   (long)(int)local_c * 4),(ulong)uVar2 % (ulong)uVar3);
      }
      else {
        NaPrintLog("      ->");
      }
      local_c = 0;
      while( true ) {
        pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
        uVar2 = (*pNVar6->_vptr_NaVector[6])();
        if (uVar2 <= local_c) break;
        in_stack_ffffffffffffffc8 = (NaPetriCnInput *)&in_RDI[5].nActivations;
        uVar2 = local_10;
        pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffffc8);
        (*pNVar6->_vptr_NaVector[6])();
        pNVar7 = NaVector::operator[]
                           ((NaVector *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
        NaPrintLog((char *)*pNVar7," %g");
        local_c = local_c + 1;
      }
      NaPrintLog("\n");
      local_10 = local_10 + 1;
    }
  }
  return;
}

Assistant:

void
NaPNDelay::print_status ()
{
  int	i, j;

  /* Print delay information anyway */
  NaPrintLog("NaPNDelay (%p, %s.%s):", this, net()->name(), name());
  NaPrintLog("  nMaxLag=%u,  nMinLag=%u\n", nMaxLag, nMinLag);
  NaPrintLog("  nActiveSleep=%u\n", nActiveSleep);
  NaPrintLog("  bAwaken=%s\n", bAwaken?"true":"false");
  if(!bSleepValue)
      NaPrintLog("  bSleepValue=false\n");
  else if(bSleepValue1st)
      NaPrintLog("  bSleepValue=true,  fSleepValue=(First)\n");
  else
      NaPrintLog("  bSleepValue=true,  fSleepValue=%g\n", fSleepValue);
  NaPrintLog("  delays map:");
  for(i = 0; i < nOutDim; ++i)
    NaPrintLog(" %u", piOutMap[i]);
  NaPrintLog("\n");

  if(!tunable()){
    /* Additional runtime info */
    NaPrintLog("  delayed values in buffer:\n");
    for(j = 0; j < vBuffer.dim() / in.data().dim(); ++j){
      for(i = 0; i < nOutDim; ++i)
	if(piOutMap[i] == j)
	  break;
      if(i < nOutDim)
	NaPrintLog("  [%d] ->", piOutMap[i]);
      else
	NaPrintLog("      ->");

      for(i = 0; i < in.data().dim(); ++i)
	NaPrintLog(" %g", vBuffer[j * in.data().dim() + i]);
      NaPrintLog("\n");
    }
  }
}